

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotations_t *
opengv::relative_pose::sixpt
          (rotations_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  rotations_t *prVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  size_t i;
  size_t sVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bearingVector_t f2;
  bearingVector_t f1;
  Matrix<double,_6,_6,_0,_6,_6> L2;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  double *local_378;
  double *local_370;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false> *local_368;
  Matrix<double,_3,_1,_0,_3,_1> *local_360;
  double dStack_358;
  Matrix<double,_3,_1,_0,_3,_1> local_350;
  long local_330;
  Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false> local_328;
  rotations_t *local_2e0;
  size_t local_2d8;
  Matrix<double,_3,_1,_0,_3,_1> local_2d0;
  Matrix<double,_3,_1,_0,_3,_1> local_2b8;
  Matrix<double,_6,_6,_0,_6,_6> local_2a0;
  Matrix<double,_6,_6,_0,_6,_6> local_180;
  
  local_2d8 = indices->_numberCorrespondences;
  local_378 = (double *)&local_2a0;
  local_370 = (double *)&local_180;
  lVar10 = 0;
  local_2e0 = __return_storage_ptr__;
  for (sVar9 = 0; prVar5 = local_2e0, local_2d8 != sVar9; sVar9 = sVar9 + 1) {
    iVar8 = (int)sVar9;
    lVar7 = lVar10 >> 0x1e;
    iVar6 = iVar8;
    if (indices->_useIndices != false) {
      iVar6 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    (*adapter->_vptr_RelativeAdapterBase[6])(&local_328,adapter,(long)iVar6);
    iVar6 = iVar8;
    if (indices->_useIndices != false) {
      iVar6 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    (*adapter->_vptr_RelativeAdapterBase[2])(&local_2d0,adapter,(long)iVar6);
    local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)&local_2d0;
    local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)&local_328;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2b8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_350);
    iVar6 = iVar8;
    if (indices->_useIndices != false) {
      iVar6 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    (*adapter->_vptr_RelativeAdapterBase[8])(&local_328,adapter,(long)iVar6);
    iVar6 = iVar8;
    if (indices->_useIndices != false) {
      iVar6 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    local_330 = lVar10;
    (*adapter->_vptr_RelativeAdapterBase[3])(&local_350,adapter,(long)iVar6);
    local_368 = &local_328;
    local_360 = &local_350;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2d0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_368);
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_xpr =
         &local_180;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_0>.m_data =
         local_370;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startRow.
    m_value = 0;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_outerStride = 6
    ;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startCol.
    m_value = sVar9;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_328,&local_2b8);
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_xpr =
         &local_2a0;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_0>.m_data =
         local_378;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startRow.
    m_value = 0;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_outerStride = 6
    ;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startCol.
    m_value = sVar9;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_328,&local_2d0);
    lVar10 = local_330;
    lVar7 = local_330 >> 0x1e;
    iVar6 = iVar8;
    if (indices->_useIndices != false) {
      iVar6 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    (*adapter->_vptr_RelativeAdapterBase[5])(&local_368,adapter,(long)iVar6);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar17._8_8_ =
         local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    auVar17._0_8_ =
         local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_368;
    auVar21._8_8_ = dStack_358;
    auVar21._0_8_ = dStack_358;
    auVar4._8_8_ = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
    auVar4._0_8_ = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
    auVar1._8_8_ = dStack_358;
    auVar1._0_8_ = local_360;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_0>.m_data =
         local_370 + 3;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_xpr =
         &local_180;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startRow.
    m_value = 3;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_outerStride = 6
    ;
    auVar12 = vunpcklpd_avx(auVar17,auVar15);
    auVar11 = vunpcklpd_avx(auVar21,auVar11);
    auVar18._0_8_ = (double)local_360 * auVar12._0_8_;
    auVar18._8_8_ = dStack_358 * auVar12._8_8_;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (double)local_368 *
         local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar12 = vfmsub231sd_fma(auVar12,auVar15,auVar1);
    local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
    _0_16_ = vfmsub213pd_fma(auVar11,auVar4,auVar18);
    local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = auVar12._0_8_;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startCol.
    m_value = sVar9;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_328,&local_350);
    if (indices->_useIndices != false) {
      iVar8 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar7);
    }
    (*adapter->_vptr_RelativeAdapterBase[7])(&local_368,adapter,(long)iVar8);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar19._8_8_ =
         local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    auVar19._0_8_ =
         local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_368;
    auVar22._8_8_ = dStack_358;
    auVar22._0_8_ = dStack_358;
    auVar3._8_8_ = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2];
    auVar3._0_8_ = local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1];
    auVar2._8_8_ = dStack_358;
    auVar2._0_8_ = local_360;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false>,_0>.m_data =
         local_378 + 3;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_xpr =
         &local_2a0;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startRow.
    m_value = 3;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_outerStride = 6
    ;
    auVar12 = vunpcklpd_avx(auVar19,auVar16);
    auVar11 = vunpcklpd_avx(auVar22,auVar13);
    auVar20._0_8_ = (double)local_360 * auVar12._0_8_;
    auVar20._8_8_ = dStack_358 * auVar12._8_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (double)local_368 *
         local_2d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    auVar12 = vfmsub231sd_fma(auVar14,auVar16,auVar2);
    local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
    _0_16_ = vfmsub213pd_fma(auVar11,auVar3,auVar20);
    local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = auVar12._0_8_;
    local_328.super_BlockImpl<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_1,_false,_true>.m_startCol.
    m_value = sVar9;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_328,&local_350);
    local_370 = local_370 + 6;
    local_378 = local_378 + 6;
    lVar10 = lVar10 + 0x100000000;
  }
  (local_2e0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_2e0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2e0->
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modules::sixpt_main(&local_180,&local_2a0,local_2e0);
  return prVar5;
}

Assistant:

rotations_t sixpt(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences == 6);

  Eigen::Matrix<double,6,6> L1;
  Eigen::Matrix<double,6,6> L2;

  for(size_t i = 0; i < numberCorrespondences; i++)
  {
    bearingVector_t f1 =
        adapter.getCamRotation1(indices[i]) * adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 =
        adapter.getCamRotation2(indices[i]) * adapter.getBearingVector2(indices[i]);
        
    L1.block<3,1>(0,i) = f1;
    L2.block<3,1>(0,i) = f2;
    
    L1.block<3,1>(3,i) = f1.cross(adapter.getCamOffset1(indices[i]));
    L2.block<3,1>(3,i) = f2.cross(adapter.getCamOffset2(indices[i]));
  }

  rotations_t solutions;
  modules::sixpt_main( L1, L2, solutions );  
  return solutions;
}